

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# instructions_list.c
# Opt level: O1

void stosw_(PDISASM pMyDisasm)

{
  char *pcVar1;
  Int64 *pIVar2;
  int iVar3;
  UInt8 UVar4;
  UInt8 UVar5;
  UInt8 UVar6;
  UInt8 UVar7;
  UInt8 UVar8;
  UInt8 UVar9;
  UInt8 UVar10;
  Int32 IVar11;
  
  if ((pMyDisasm->Prefix).RepnePrefix == '\x02') {
    (pMyDisasm->Prefix).RepnePrefix = '\x01';
  }
  if ((pMyDisasm->Prefix).RepPrefix == '\x02') {
    (pMyDisasm->Prefix).RepPrefix = '\x01';
  }
  (pMyDisasm->Instruction).Category = 0x10007;
  iVar3 = (pMyDisasm->Reserved_).OperandSize;
  pcVar1 = (pMyDisasm->Instruction).Mnemonic;
  if (iVar3 == 0x20) {
    builtin_strncpy(pcVar1,"stosd",6);
    IVar11 = 0x20;
  }
  else if (iVar3 == 0x40) {
    builtin_strncpy(pcVar1,"stosq",6);
    IVar11 = 0x40;
  }
  else {
    builtin_strncpy(pcVar1,"stosw",6);
    IVar11 = 0x10;
  }
  (pMyDisasm->Operand2).OpType = 0x20000;
  (pMyDisasm->Operand2).Registers.type = 1;
  (pMyDisasm->Operand2).Registers.gpr = 1;
  (pMyDisasm->Operand2).OpSize = IVar11;
  (pMyDisasm->Operand1).OpType = 0x30000;
  (pMyDisasm->Operand1).Memory.BaseRegister = 0x80;
  (pMyDisasm->Operand1).OpSize = IVar11;
  (pMyDisasm->Instruction).ImplicitModifiedRegs.gpr = 0x80;
  (pMyDisasm->Reserved_).EIP_ = (pMyDisasm->Reserved_).EIP_ + 1;
  (pMyDisasm->Instruction).ImplicitModifiedRegs.type = 0x21;
  pIVar2 = &(pMyDisasm->Instruction).ImplicitModifiedRegs.special;
  *(byte *)pIVar2 = (byte)*pIVar2 | 1;
  UVar4 = EFLAGS_TABLE[0x65].SF_;
  UVar5 = EFLAGS_TABLE[0x65].ZF_;
  UVar6 = EFLAGS_TABLE[0x65].AF_;
  UVar7 = EFLAGS_TABLE[0x65].PF_;
  UVar8 = EFLAGS_TABLE[0x65].CF_;
  UVar9 = EFLAGS_TABLE[0x65].TF_;
  UVar10 = EFLAGS_TABLE[0x65].IF_;
  (pMyDisasm->Instruction).Flags.OF_ = EFLAGS_TABLE[0x65].OF_;
  (pMyDisasm->Instruction).Flags.SF_ = UVar4;
  (pMyDisasm->Instruction).Flags.ZF_ = UVar5;
  (pMyDisasm->Instruction).Flags.AF_ = UVar6;
  (pMyDisasm->Instruction).Flags.PF_ = UVar7;
  (pMyDisasm->Instruction).Flags.CF_ = UVar8;
  (pMyDisasm->Instruction).Flags.TF_ = UVar9;
  (pMyDisasm->Instruction).Flags.IF_ = UVar10;
  UVar4 = EFLAGS_TABLE[0x65].NT_;
  UVar5 = EFLAGS_TABLE[0x65].RF_;
  UVar6 = EFLAGS_TABLE[0x65].alignment;
  (pMyDisasm->Instruction).Flags.DF_ = EFLAGS_TABLE[0x65].DF_;
  (pMyDisasm->Instruction).Flags.NT_ = UVar4;
  (pMyDisasm->Instruction).Flags.RF_ = UVar5;
  (pMyDisasm->Instruction).Flags.alignment = UVar6;
  return;
}

Assistant:

void __bea_callspec__ stosw_(PDISASM pMyDisasm)
{
    if (pMyDisasm->Prefix.RepnePrefix == SuperfluousPrefix) {
        pMyDisasm->Prefix.RepnePrefix = InUsePrefix;
    }
    if (pMyDisasm->Prefix.RepPrefix == SuperfluousPrefix) {
        pMyDisasm->Prefix.RepPrefix = InUsePrefix;
    }
    pMyDisasm->Instruction.Category = GENERAL_PURPOSE_INSTRUCTION+STRING_INSTRUCTION;
    if (GV.OperandSize == 64) {
        #ifndef BEA_LIGHT_DISASSEMBLY
           (void) strcpy (pMyDisasm->Instruction.Mnemonic, "stosq");
        #endif
        pMyDisasm->Operand2.OpType = REGISTER_TYPE;
  pMyDisasm->Operand2.Registers.type = GENERAL_REG;
  pMyDisasm->Operand2.Registers.gpr = REG0;
        pMyDisasm->Operand2.OpSize = 64;
        pMyDisasm->Operand1.OpType = MEMORY_TYPE;
        pMyDisasm->Operand1.Memory.BaseRegister = REG7;
        pMyDisasm->Operand1.OpSize = 64;
        pMyDisasm->Instruction.ImplicitModifiedRegs.type = GENERAL_REG;
        pMyDisasm->Instruction.ImplicitModifiedRegs.gpr = REG7;
        GV.EIP_++;
        FillFlags(pMyDisasm, 101);
    }
    else if (GV.OperandSize == 32) {
        #ifndef BEA_LIGHT_DISASSEMBLY
           (void) strcpy (pMyDisasm->Instruction.Mnemonic, "stosd");
        #endif
        pMyDisasm->Operand2.OpType = REGISTER_TYPE;
  pMyDisasm->Operand2.Registers.type = GENERAL_REG;
  pMyDisasm->Operand2.Registers.gpr = REG0;
        pMyDisasm->Operand2.OpSize = 32;
        pMyDisasm->Operand1.OpType = MEMORY_TYPE;
        pMyDisasm->Operand1.Memory.BaseRegister = REG7;
        pMyDisasm->Operand1.OpSize = 32;
        pMyDisasm->Instruction.ImplicitModifiedRegs.type = GENERAL_REG;
        pMyDisasm->Instruction.ImplicitModifiedRegs.gpr = REG7;
        GV.EIP_++;
        FillFlags(pMyDisasm, 101);
    }
    else {
        #ifndef BEA_LIGHT_DISASSEMBLY
           (void) strcpy (pMyDisasm->Instruction.Mnemonic, "stosw");
        #endif
        pMyDisasm->Operand2.OpType = REGISTER_TYPE;
  pMyDisasm->Operand2.Registers.type = GENERAL_REG;
  pMyDisasm->Operand2.Registers.gpr = REG0;
        pMyDisasm->Operand2.OpSize = 16;
        pMyDisasm->Operand1.OpType = MEMORY_TYPE;
        pMyDisasm->Operand1.Memory.BaseRegister = REG7;
        pMyDisasm->Operand1.OpSize = 16;
        pMyDisasm->Instruction.ImplicitModifiedRegs.type = GENERAL_REG;
        pMyDisasm->Instruction.ImplicitModifiedRegs.gpr = REG7;
        GV.EIP_++;
        FillFlags(pMyDisasm, 101);
    }
}